

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

int lys_type_is_local(lys_type *type)

{
  uint uVar1;
  lys_module *plVar2;
  lys_module *plVar3;
  
  plVar2 = type->der->module;
  if (plVar2 == (lys_module *)0x0) {
    uVar1 = 1;
  }
  else {
    if ((plVar2->field_0x40 & 1) != 0) {
      plVar2 = (lys_module *)plVar2->data;
    }
    plVar3 = type->parent->module;
    if (plVar3 == (lys_module *)0x0) {
      plVar3 = (lys_module *)0x0;
    }
    else if ((plVar3->field_0x40 & 1) != 0) {
      plVar3 = (lys_module *)plVar3->data;
    }
    uVar1 = (uint)(plVar2 == plVar3);
  }
  return uVar1;
}

Assistant:

int
lys_type_is_local(const struct lys_type *type)
{
    if (!type->der->module) {
        /* build-in type */
        return 1;
    }
    /* type->parent can be either a typedef or leaf/leaf-list, but module pointers are compatible */
    return (lys_main_module(type->der->module) == lys_main_module(((struct lys_tpdf *)type->parent)->module));
}